

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

void __thiscall ccs::ParserImpl::parseRule(ParserImpl *this,Nested *ast)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Location LVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  tuple<ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_> ast_00;
  string *psVar5;
  ostringstream _message;
  __uniq_ptr_impl<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> local_1c0;
  long local_1b8;
  long local_1b0;
  ParserImpl local_198;
  
  bVar4 = parsePrimRule(this,ast);
  if (bVar4) {
    if ((this->cur_).type == SEMI) {
      advance(this);
      return;
    }
  }
  else {
    ast_00.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
    super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
         operator_new(0x30);
    *(undefined8 *)
     ast_00.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
     super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl = 0;
    (((shared_ptr<ccs::ast::SelectorBranch> *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8))->
    super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    *(pointer *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    *(pointer *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)ast_00.
           super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
           super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x10))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (((vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
       *)((long)ast_00.
                super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(undefined ***)
     ast_00.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
     super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl = &PTR__Nested_001aa430;
    (((vector<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
       *)((long)ast_00.
                super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x18))->
    super__Vector_base<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>,_std::allocator<std::unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    *(pointer *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x20) = (pointer)0x0;
    (((shared_ptr<ccs::ast::SelectorBranch> *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8))->
    super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)ast_00.
           super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
           super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x10))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(pointer *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x28) = (pointer)0x0;
    parseSelector(&local_198);
    sVar3 = local_198.fileName_._M_string_length;
    _Var2._M_p = local_198.fileName_._M_dataplus._M_p;
    local_198.fileName_._M_dataplus._M_p = (pointer)0x0;
    local_198.fileName_._M_string_length = 0;
    this_00 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
              ((long)ast_00.
                     super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                     .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x10))->_M_pi
    ;
    (((shared_ptr<ccs::ast::SelectorBranch> *)
     ((long)ast_00.
            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
            super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8))->
    super___shared_ptr<ccs::ast::SelectorBranch,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)_Var2._M_p;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)ast_00.
           super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
           super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x10))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)sVar3;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198.fileName_._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_198.fileName_._M_string_length);
    }
    if ((this->cur_).type == COLON) {
      advance(this);
      bVar4 = parsePrimRule(this,(Nested *)
                                 ast_00.
                                 super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                                 .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl);
      if (!bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_198,"Expected @import, @constrain, or property setting",0x31);
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LVar1 = (this->cur_).location;
        *(string **)psVar5 = psVar5 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar5,local_1b8,local_1b0 + local_1b8);
        *(Location *)(psVar5 + 0x20) = LVar1;
        __cxa_throw(psVar5,&(anonymous_namespace)::parse_error::typeinfo,
                    anon_unknown_0::parse_error::~parse_error);
      }
      if ((this->cur_).type == SEMI) {
        advance(this);
      }
    }
    else {
      if ((this->cur_).type != LBRACE) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_198,"Expected \':\' or \'{\' following selector",0x26);
        psVar5 = (string *)__cxa_allocate_exception(0x28);
        std::__cxx11::stringbuf::str();
        LVar1 = (this->cur_).location;
        *(string **)psVar5 = psVar5 + 0x10;
        std::__cxx11::string::_M_construct<char*>(psVar5,local_1b8,local_1b0 + local_1b8);
        *(Location *)(psVar5 + 0x20) = LVar1;
        __cxa_throw(psVar5,&(anonymous_namespace)::parse_error::typeinfo,
                    anon_unknown_0::parse_error::~parse_error);
      }
      advance(this);
      while ((this->cur_).type != RBRACE) {
        parseRule(this,(Nested *)
                       ast_00.
                       super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                       .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl);
      }
      advance(this);
    }
    local_1c0._M_t.
    super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
    super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl =
         (tuple<ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
         (tuple<ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
         ast_00.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
         .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl;
    std::
    vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
    ::emplace_back<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>
              ((vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
                *)&ast->rules_,
               (unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> *)&local_1c0)
    ;
    if ((_Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
        local_1c0._M_t.
        super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
        super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl != (AstRule *)0x0) {
      (**(code **)(*(long *)local_1c0._M_t.
                            super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                            .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8))();
    }
  }
  return;
}

Assistant:

void parseRule(ast::Nested &ast) {
    // the only ambiguity is between ident as start of a property setting
    // and ident as start of a selector, i.e.:
    //   foo = bar
    //   foo : bar = 'baz'
    // we can use the presence of '=' to disambiguate. parsePrimRule() performs
    // this lookahead without consuming the additional token.
    if (parsePrimRule(ast)) {
      advanceIf(Token::SEMI);
      return;
    }

    auto nested = std::make_unique<ast::Nested>();
    nested->selector_ = parseSelector();

    if (advanceIf(Token::COLON)) {
      if (!parsePrimRule(*nested))
        THROW(cur_.location,
            "Expected @import, @constrain, or property setting");
      advanceIf(Token::SEMI);
    } else if (advanceIf(Token::LBRACE)) {
      while (!advanceIf(Token::RBRACE)) parseRule(*nested);
    } else {
      THROW(cur_.location, "Expected ':' or '{' following selector");
    }

    ast.addRule(std::move(nested));
  }